

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcColourRgb::~IfcColourRgb(IfcColourRgb *this,void **vtt)

{
  void **vtt_local;
  IfcColourRgb *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourRgb,_3UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourRgb,_3UL> *)
             &(this->super_IfcColourSpecification).field_0x38,vtt + 5);
  IfcColourSpecification::~IfcColourSpecification(&this->super_IfcColourSpecification,vtt + 1);
  return;
}

Assistant:

IfcColourRgb() : Object("IfcColourRgb") {}